

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbconnection_xi2.cpp
# Opt level: O0

bool __thiscall
QXcbConnection::startSystemMoveResizeForTouch(QXcbConnection *this,xcb_window_t window,int edges)

{
  State SVar1;
  bool bVar2;
  int iVar3;
  TouchPoint *pTVar4;
  int *piVar5;
  undefined4 in_EDX;
  undefined4 in_ESI;
  TouchDeviceData *in_RDI;
  long in_FS_OFFSET;
  State state;
  const_iterator pointIt;
  const_iterator devIt;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  TouchDeviceData deviceData;
  undefined7 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeef;
  int in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  TouchDeviceData *this_00;
  byte local_e9;
  QDebug in_stack_ffffffffffffff38;
  undefined8 local_80;
  ulong local_78;
  undefined1 local_70 [104];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  QHash<int,_QXcbConnection::TouchDeviceData>::constBegin
            ((QHash<int,_QXcbConnection::TouchDeviceData> *)in_RDI);
  while( true ) {
    QHash<int,_QXcbConnection::TouchDeviceData>::constEnd
              ((QHash<int,_QXcbConnection::TouchDeviceData> *)
               CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    bVar2 = QHash<int,_QXcbConnection::TouchDeviceData>::const_iterator::operator!=
                      ((const_iterator *)
                       CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                       (const_iterator *)in_RDI);
    if (!bVar2) break;
    memcpy(local_70,&DAT_002380e8,0x68);
    QHash<int,_QXcbConnection::TouchDeviceData>::const_iterator::value((const_iterator *)0x1813dc);
    TouchDeviceData::TouchDeviceData
              (in_RDI,(TouchDeviceData *)
                      CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
    iVar3 = QInputDevice::type();
    if (iVar3 == 2) {
      QHash<int,_QWindowSystemInterface::TouchPoint>::constBegin
                ((QHash<int,_QWindowSystemInterface::TouchPoint> *)this_00);
LAB_00181435:
      QHash<int,_QWindowSystemInterface::TouchPoint>::constEnd
                ((QHash<int,_QWindowSystemInterface::TouchPoint> *)
                 CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      bVar2 = QHash<int,_QWindowSystemInterface::TouchPoint>::const_iterator::operator!=
                        ((const_iterator *)
                         CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                         (const_iterator *)in_RDI);
      if (bVar2) {
        pTVar4 = QHash<int,_QWindowSystemInterface::TouchPoint>::const_iterator::value
                           ((const_iterator *)0x181472);
        SVar1 = pTVar4->state;
        in_stack_fffffffffffffefc = CONCAT13(SVar1,(int3)in_stack_fffffffffffffefc);
        if (((SVar1 != Updated) && (SVar1 != Pressed)) && (SVar1 != Stationary)) goto LAB_001815a1;
        *(undefined4 *)&in_RDI[7].firstPressedPosition.xp = in_ESI;
        piVar5 = QHash<int,_QXcbConnection::TouchDeviceData>::const_iterator::key
                           ((const_iterator *)0x1814b7);
        *(short *)((long)&in_RDI[7].firstPressedPosition.xp + 4) = (short)*piVar5;
        piVar5 = QHash<int,_QWindowSystemInterface::TouchPoint>::const_iterator::key
                           ((const_iterator *)0x1814d2);
        *(int *)&in_RDI[7].firstPressedPosition.yp = *piVar5;
        *(undefined4 *)((long)&in_RDI[7].firstPressedPosition.yp + 4) = in_EDX;
        setDuringSystemMoveResize((QXcbConnection *)in_RDI,true);
        local_80 = 0xaaaaaaaaaaaaaaaa;
        local_78 = 0xaaaaaaaaaaaaaaaa;
        QtPrivateLogging::lcQpaInputDevices();
        anon_unknown.dwarf_1494a3::QLoggingCategoryMacroHolder<(QtMsgType)0>::
        QLoggingCategoryMacroHolder
                  ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)in_RDI,
                   (QLoggingCategory *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8)
                  );
        while (bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                                 ((QLoggingCategoryMacroHolder *)&local_80), bVar2) {
          anon_unknown.dwarf_1494a3::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                    ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x181546);
          QMessageLogger::QMessageLogger
                    ((QMessageLogger *)CONCAT44(in_ESI,in_EDX),
                     (char *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                     (int)((ulong)in_RDI >> 0x20),
                     (char *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8),
                     (char *)0x18155c);
          QMessageLogger::debug();
          QDebug::operator<<((QDebug *)this_00,(char *)in_stack_ffffffffffffff38.stream);
          QDebug::~QDebug((QDebug *)&stack0xffffffffffffff38);
          local_78 = local_78 & 0xffffffffffffff00;
        }
        local_e9 = 1;
        in_stack_fffffffffffffef8 = 1;
        goto LAB_001815ba;
      }
    }
    in_stack_fffffffffffffef8 = 0;
LAB_001815ba:
    TouchDeviceData::~TouchDeviceData(in_RDI);
    if (in_stack_fffffffffffffef8 != 0) goto LAB_001815ec;
    QHash<int,_QXcbConnection::TouchDeviceData>::const_iterator::operator++
              ((const_iterator *)CONCAT44(in_ESI,in_EDX));
  }
  local_e9 = 0;
LAB_001815ec:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(local_e9 & 1);
LAB_001815a1:
  QHash<int,_QWindowSystemInterface::TouchPoint>::const_iterator::operator++
            ((const_iterator *)CONCAT44(in_ESI,in_EDX));
  goto LAB_00181435;
}

Assistant:

bool QXcbConnection::startSystemMoveResizeForTouch(xcb_window_t window, int edges)
{
    QHash<int, TouchDeviceData>::const_iterator devIt = m_touchDevices.constBegin();
    for (; devIt != m_touchDevices.constEnd(); ++devIt) {
        TouchDeviceData deviceData = devIt.value();
        if (deviceData.qtTouchDevice->type() == QInputDevice::DeviceType::TouchScreen) {
            auto pointIt = deviceData.touchPoints.constBegin();
            for (; pointIt != deviceData.touchPoints.constEnd(); ++pointIt) {
                QEventPoint::State state = pointIt.value().state;
                if (state == QEventPoint::State::Updated || state == QEventPoint::State::Pressed || state == QEventPoint::State::Stationary) {
                    m_startSystemMoveResizeInfo.window = window;
                    m_startSystemMoveResizeInfo.deviceid = devIt.key();
                    m_startSystemMoveResizeInfo.pointid = pointIt.key();
                    m_startSystemMoveResizeInfo.edges = edges;
                    setDuringSystemMoveResize(true);
                    qCDebug(lcQpaInputDevices) << "triggered system move or resize from touch";
                    return true;
                }
            }
        }
    }
    return false;
}